

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_context.c
# Opt level: O1

SUNErrCode SUNContext_GetProfiler(SUNContext sunctx,SUNProfiler *profiler)

{
  if (sunctx != (SUNContext)0x0) {
    *profiler = (SUNProfiler)0x0;
    return 0;
  }
  return -0x26f5;
}

Assistant:

SUNErrCode SUNContext_GetProfiler(SUNContext sunctx, SUNProfiler* profiler)
{
  if (!sunctx) { return SUN_ERR_SUNCTX_CORRUPT; }

  SUNFunctionBegin(sunctx);

#ifdef SUNDIALS_BUILD_WITH_PROFILING
  /* get profiler */
  *profiler = sunctx->profiler;
#else
  *profiler = NULL;
#endif

  return SUN_SUCCESS;
}